

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

char * __thiscall asmjit::StringBuilder::prepare(StringBuilder *this,uint32_t op,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong in_RDX;
  int in_ESI;
  StringBuilder *in_RDI;
  char *ret;
  char *newData_1;
  size_t to_1;
  size_t after;
  char *newData;
  size_t to;
  char *in_stack_00000340;
  int in_stack_0000034c;
  char *in_stack_00000350;
  ulong local_90;
  ulong local_78;
  char *local_58;
  
  if (in_ESI == 0) {
    if (in_RDX == 0) {
      if (in_RDI->_data != "") {
        *in_RDI->_data = '\0';
      }
      in_RDI->_length = 0;
      local_58 = in_RDI->_data;
    }
    else {
      if (in_RDI->_capacity < in_RDX) {
        if (0xffffffffffffffee < in_RDX) {
          return (char *)0x0;
        }
        local_78 = in_RDX + 7 & 0xfffffffffffffff8;
        if (local_78 < 0xf8) {
          local_78 = 0xf8;
        }
        pcVar1 = (char *)malloc(local_78 + 8);
        if (pcVar1 == (char *)0x0) {
          clear(in_RDI);
          return (char *)0x0;
        }
        if (in_RDI->_canFree != 0) {
          free(in_RDI->_data);
        }
        in_RDI->_data = pcVar1;
        in_RDI->_capacity = local_78 + 7;
        in_RDI->_canFree = 1;
      }
      in_RDI->_data[in_RDX] = '\0';
      in_RDI->_length = in_RDX;
      if (in_RDI->_capacity < in_RDI->_length) {
        DebugUtils::assertionFailed(in_stack_00000350,in_stack_0000034c,in_stack_00000340);
      }
      local_58 = in_RDI->_data;
    }
  }
  else if (in_RDX == 0) {
    local_58 = in_RDI->_data + in_RDI->_length;
  }
  else if (-in_RDI->_length - 0x11 < in_RDX) {
    local_58 = (char *)0x0;
  }
  else {
    uVar3 = in_RDI->_length + in_RDX;
    if (in_RDI->_capacity < uVar3) {
      local_90 = in_RDI->_capacity;
      if (local_90 < 0x100) {
        local_90 = 0x100;
      }
      for (; local_90 < 0x100000 && local_90 < uVar3; local_90 = local_90 << 1) {
      }
      if ((local_90 < uVar3) && (local_90 = uVar3, uVar3 < 0xffffffffffff7fff)) {
        local_90 = uVar3 + 0x7fff & 0xffffffffffff8000;
      }
      uVar2 = local_90 + 7 & 0xfffffffffffffff8;
      pcVar1 = (char *)malloc(uVar2 + 8);
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      memcpy(pcVar1,in_RDI->_data,in_RDI->_length);
      if (in_RDI->_canFree != 0) {
        free(in_RDI->_data);
      }
      in_RDI->_data = pcVar1;
      in_RDI->_capacity = uVar2 + 7;
      in_RDI->_canFree = 1;
    }
    local_58 = in_RDI->_data + in_RDI->_length;
    in_RDI->_data[uVar3] = '\0';
    in_RDI->_length = uVar3;
    if (in_RDI->_capacity < in_RDI->_length) {
      DebugUtils::assertionFailed(in_stack_00000350,in_stack_0000034c,in_stack_00000340);
    }
  }
  return local_58;
}

Assistant:

ASMJIT_FAVOR_SIZE char* StringBuilder::prepare(uint32_t op, size_t len) noexcept {
  if (op == kStringOpSet) {
    // We don't care here, but we can't return a null pointer since it indicates
    // failure in memory allocation.
    if (len == 0) {
      if (_data != StringBuilder_empty)
        _data[0] = 0;

      _length = 0;
      return _data;
    }

    if (_capacity < len) {
      if (len >= IntTraits<size_t>::maxValue() - sizeof(intptr_t) * 2)
        return nullptr;

      size_t to = Utils::alignTo<size_t>(len, sizeof(intptr_t));
      if (to < 256 - sizeof(intptr_t))
        to = 256 - sizeof(intptr_t);

      char* newData = static_cast<char*>(Internal::allocMemory(to + sizeof(intptr_t)));
      if (!newData) {
        clear();
        return nullptr;
      }

      if (_canFree)
        Internal::releaseMemory(_data);

      _data = newData;
      _capacity = to + sizeof(intptr_t) - 1;
      _canFree = true;
    }

    _data[len] = 0;
    _length = len;

    ASMJIT_ASSERT(_length <= _capacity);
    return _data;
  }
  else {
    // We don't care here, but we can't return a null pointer since it indicates
    // failure of memory allocation.
    if (len == 0)
      return _data + _length;

    // Overflow.
    if (IntTraits<size_t>::maxValue() - sizeof(intptr_t) * 2 - _length < len)
      return nullptr;

    size_t after = _length + len;
    if (_capacity < after) {
      size_t to = _capacity;

      if (to < 256)
        to = 256;

      while (to < 1024 * 1024 && to < after)
        to *= 2;

      if (to < after) {
        to = after;
        if (to < (IntTraits<size_t>::maxValue() - 1024 * 32))
          to = Utils::alignTo<size_t>(to, 1024 * 32);
      }

      to = Utils::alignTo<size_t>(to, sizeof(intptr_t));
      char* newData = static_cast<char*>(Internal::allocMemory(to + sizeof(intptr_t)));
      if (!newData) return nullptr;

      ::memcpy(newData, _data, _length);
      if (_canFree)
        Internal::releaseMemory(_data);

      _data = newData;
      _capacity = to + sizeof(intptr_t) - 1;
      _canFree = true;
    }

    char* ret = _data + _length;
    _data[after] = 0;
    _length = after;

    ASMJIT_ASSERT(_length <= _capacity);
    return ret;
  }
}